

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

Orphan<capnp::DynamicValue> * __thiscall
capnp::JsonCodec::Handler<capnproto_test::capnp::test::TestInterface,_(capnp::Style)3>::decodeBase
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,
          Handler<capnproto_test::capnp::test::TestInterface,_(capnp::Style)3> *this,
          JsonCodec *codec,Reader input,Type type,Orphanage orphanage)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 in_R9;
  Own<capnp::ClientHook,_std::nullptr_t> OVar3;
  undefined1 local_90 [16];
  long *local_80;
  OrphanBuilder local_78;
  Builder local_58;
  
  (*(this->super_HandlerBase)._vptr_HandlerBase[4])
            ((Client *)local_90,this,codec,type._0_8_,type.field_4.schema,in_R9,
             input._reader.segment._0_4_,input._reader.capTable._0_4_,input._reader.data._0_4_,
             input._reader.pointers._0_4_,input._reader.dataSize,input._reader.nestingLimit);
  Orphanage::newOrphanCopy<capnproto_test::capnp::test::TestInterface::Client>
            ((Orphan<capnproto_test::capnp::test::TestInterface> *)&local_78,&orphanage,
             (Client *)local_90);
  OVar3 = capnp::_::OrphanBuilder::asCapability((OrphanBuilder *)&local_58);
  puVar1 = (undefined8 *)CONCAT44(local_58._4_4_,local_58.type);
  (*(code *)((local_58.field_1.anyPointerValue.builder.segment)->super_SegmentReader).arena[4].
            _vptr_Arena)(&local_58.field_1,local_58.field_1.intValue,OVar3.ptr);
  local_58.type = CAPABILITY;
  local_58.field_1.listValue.builder.segment =
       (SegmentBuilder *)(schemas::s_88eb12a0e0af92b2 + 0x48);
  Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,&local_58,&local_78);
  DynamicValue::Builder::~Builder(&local_58);
  (**(code **)*puVar1)
            (puVar1,local_58.field_1.dataValue.super_ArrayPtr<unsigned_char>.ptr +
                    (long)((local_58.field_1.anyPointerValue.builder.segment)->super_SegmentReader).
                          arena[-2]._vptr_Arena);
  if (local_78.segment != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize(&local_78);
  }
  plVar2 = local_80;
  if (local_80 != (long *)0x0) {
    local_80 = (long *)0x0;
    (*(code *)**(undefined8 **)local_90._8_8_)
              (local_90._8_8_,(long)plVar2 + *(long *)(*plVar2 + -0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> decodeBase(const JsonCodec& codec, JsonValue::Reader input,
                                  Type type, Orphanage orphanage) const override final {
    return orphanage.newOrphanCopy(decode(codec, input));
  }